

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Lms_GiaNormalize(Lms_Man_t *p)

{
  int nCap;
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined8 extraout_RDX_02;
  int iVar6;
  int iVar7;
  
  p_01 = Lms_GiaFindNonRedundantCos(p);
  nCap = p_01->nSize;
  p_02 = Vec_IntAlloc(nCap);
  iVar6 = 0;
  iVar7 = 0;
  if (0 < nCap) {
    iVar7 = nCap;
  }
  uVar5 = extraout_RDX;
  iVar2 = -1;
  for (; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    iVar1 = Vec_IntEntry(p_01,iVar6);
    pGVar3 = Gia_ManCo(p->pGia,iVar1);
    if (((int)(uint)*(undefined8 *)(pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff)) < 0) ||
       (((uint)*(undefined8 *)(pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff)) & 0x1fffffff) ==
        0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(Gia_ObjFanin0(pObj))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x50b,"void Lms_GiaNormalize(Lms_Man_t *)");
    }
    iVar1 = Gia_ObjId(p->pGia,pGVar3);
    iVar1 = Abc_Var2Lit(iVar1 - (*(uint *)pGVar3 & 0x1fffffff),*(uint *)pGVar3 >> 0x1d & 1);
    Vec_IntWriteEntry(p_01,iVar6,iVar1);
    p_00 = p->vTruthIds;
    iVar1 = Gia_ObjCioId(pGVar3);
    iVar1 = Vec_IntEntry(p_00,iVar1);
    if (iVar1 < iVar2) {
      __assert_fail("Prev <= Next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x50f,"void Lms_GiaNormalize(Lms_Man_t *)");
    }
    Vec_IntPush(p_02,iVar1);
    uVar5 = extraout_RDX_00;
    iVar2 = iVar1;
  }
  iVar6 = 0;
  while (iVar6 < p->pGia->nObjs) {
    pGVar3 = Gia_ManObj(p->pGia,iVar6);
    uVar5 = extraout_RDX_01;
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar6 = iVar6 + 1;
    if ((pGVar3->field_0x3 & 0x40) != 0) {
      __assert_fail("pObj->fMark0 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x515,"void Lms_GiaNormalize(Lms_Man_t *)");
    }
  }
  for (iVar6 = 0; iVar6 < p->pGia->vCos->nSize; iVar6 = iVar6 + 1) {
    Gia_ManPatchCoDriver(p->pGia,iVar6,(int)uVar5);
    uVar5 = extraout_RDX_02;
  }
  for (iVar6 = 0; iVar7 != iVar6; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar6);
    Gia_ManAppendCo(p->pGia,iVar2);
  }
  pGVar4 = Gia_ManCleanupOutputs(p->pGia,p->pGia->vCos->nSize - nCap);
  Gia_ManStop(p->pGia);
  p->pGia = pGVar4;
  Vec_IntFree(p_01);
  Vec_IntFree(p->vTruthIds);
  p->vTruthIds = p_02;
  return;
}

Assistant:

void Lms_GiaNormalize( Lms_Man_t * p )
{
    Gia_Man_t * pGiaNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vRemain;
    Vec_Int_t * vTruthIdsNew;
    int i, Entry, Prev = -1, Next;
    // collect non-redundant COs
    vRemain = Lms_GiaFindNonRedundantCos( p );
    // change these to be useful literals
    vTruthIdsNew = Vec_IntAlloc( Vec_IntSize(vRemain) );
    Vec_IntForEachEntry( vRemain, Entry, i )
    {
        pObj = Gia_ManCo(p->pGia, Entry);
        assert( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) );
        Vec_IntWriteEntry( vRemain, i, Gia_ObjFaninLit0p(p->pGia, pObj) );
        // create new truth IDs
        Next = Vec_IntEntry(p->vTruthIds, Gia_ObjCioId(pObj));
        assert( Prev <= Next );
        Vec_IntPush( vTruthIdsNew, Next );
        Prev = Next;
    }
    // create a new GIA
    Gia_ManForEachObj( p->pGia, pObj, i )
        assert( pObj->fMark0 == 0 );
    for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
        Gia_ManPatchCoDriver( p->pGia, i, 0 );
    Vec_IntForEachEntry( vRemain, Entry, i )
        Gia_ManAppendCo( p->pGia, Entry );
//    pGiaNew = Gia_ManCleanup( p->pGia );
    pGiaNew = Gia_ManCleanupOutputs( p->pGia, Gia_ManCoNum(p->pGia) - Vec_IntSize(vRemain) );
    Gia_ManStop( p->pGia );
    p->pGia = pGiaNew;
    Vec_IntFree( vRemain );
    // update truth IDs
    Vec_IntFree( p->vTruthIds );
    p->vTruthIds = vTruthIdsNew;
//    Vec_IntPrint( vTruthIdsNew );
}